

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::setBasis
          (SPxSolverBase<double> *this,VarStatus *p_rows,VarStatus *p_cols)

{
  Desc *pDVar1;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar2;
  Status SVar3;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar4;
  long lVar5;
  Desc local_60;
  
  if ((this->super_SPxBasisBase<double>).thestatus == NO_PROBLEM) {
    (this->super_SPxBasisBase<double>).theLP = this;
    (this->super_SPxBasisBase<double>).spxout = this->spxout;
    SPxBasisBase<double>::reDim(&this->super_SPxBasisBase<double>);
    (this->super_SPxBasisBase<double>).minStab = 0.0;
    pDVar1 = &(this->super_SPxBasisBase<double>).thedesc;
    pDVar2 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
    pDVar4 = &pDVar1->rowstat;
    if (((this->super_SPxBasisBase<double>).theLP)->theRep == ROW) {
      pDVar4 = pDVar2;
      pDVar2 = &pDVar1->rowstat;
    }
    (this->super_SPxBasisBase<double>).thedesc.stat = pDVar2;
    (this->super_SPxBasisBase<double>).thedesc.costat = pDVar4;
  }
  SPxBasisBase<double>::Desc::Desc(&local_60,&(this->super_SPxBasisBase<double>).thedesc);
  if (0 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar5 = 0;
    do {
      SVar3 = varStatusToBasisStatusRow(this,(int)lVar5,p_rows[lVar5]);
      local_60.rowstat.data[lVar5] = SVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  if (0 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar5 = 0;
    do {
      SVar3 = varStatusToBasisStatusCol(this,(int)lVar5,p_cols[lVar5]);
      local_60.colstat.data[lVar5] = SVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x58])(this,&local_60);
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  if (local_60.colstat.data != (Status *)0x0) {
    free(local_60.colstat.data);
    local_60.colstat.data = (Status *)0x0;
  }
  if (local_60.rowstat.data != (Status *)0x0) {
    free(local_60.rowstat.data);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setBasis(const VarStatus p_rows[], const VarStatus p_cols[])
   {
      if(SPxBasisBase<R>::status() == SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::load(this, false);

      typename SPxBasisBase<R>::Desc ds = this->desc();
      int i;

      for(i = 0; i < this->nRows(); i++)
         ds.rowStatus(i) = varStatusToBasisStatusRow(i, p_rows[i]);

      for(i = 0; i < this->nCols(); i++)
         ds.colStatus(i) = varStatusToBasisStatusCol(i, p_cols[i]);

      loadBasis(ds);
      forceRecompNonbasicValue();
   }